

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::updatePaintedViewBoundingRects(QGraphicsItemPrivate *this,bool updateChildren)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *this_00;
  QGraphicsScene *pQVar3;
  int i;
  ulong uVar4;
  int i_1;
  long in_FS_OFFSET;
  QRect QVar5;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this->scene;
  if (pQVar3 != (QGraphicsScene *)0x0) {
    for (uVar4 = 0; uVar4 < *(ulong *)(*(long *)&pQVar3->field_0x8 + 0x290); uVar4 = uVar4 + 1) {
      this_00 = *(QGraphicsViewPrivate **)
                 (*(long *)(*(long *)(*(long *)&pQVar3->field_0x8 + 0x288) + uVar4 * 8) + 8);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QVar5 = QHash<QWidget_*,_QRect>::value
                        (&this->paintedViewBoundingRects,
                         &(this_00->super_QAbstractScrollAreaPrivate).viewport);
      iVar1 = (this_00->dirtyScrollOffset).xp.m_i;
      iVar2 = (this_00->dirtyScrollOffset).yp.m_i;
      local_48._4_4_ = QVar5.y1.m_i.m_i + iVar2;
      local_48._0_4_ = QVar5.x1.m_i.m_i + iVar1;
      uStack_40._4_4_ = QVar5.y2.m_i.m_i + iVar2;
      uStack_40._0_4_ = QVar5.x2.m_i.m_i + iVar1;
      QGraphicsViewPrivate::updateRect(this_00,(QRect *)&local_48);
      pQVar3 = this->scene;
    }
    if (updateChildren) {
      for (uVar4 = 0; uVar4 < (ulong)(this->children).d.size; uVar4 = uVar4 + 1) {
        updatePaintedViewBoundingRects(((this->children).d.ptr[uVar4]->d_ptr).d,true);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::updatePaintedViewBoundingRects(bool updateChildren)
{
    if (!scene)
        return;

    for (int i = 0; i < scene->d_func()->views.size(); ++i) {
        QGraphicsViewPrivate *viewPrivate = scene->d_func()->views.at(i)->d_func();
        QRect rect = paintedViewBoundingRects.value(viewPrivate->viewport);
        rect.translate(viewPrivate->dirtyScrollOffset);
        viewPrivate->updateRect(rect);
    }

    if (updateChildren) {
        for (int i = 0; i < children.size(); ++i)
            children.at(i)->d_ptr->updatePaintedViewBoundingRects(true);
    }
}